

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_longlong_range_validation(void)

{
  undefined8 *puVar1;
  cargo_t ctx;
  int iVar2;
  cargo_validation_t *vd;
  char *pcVar3;
  cargo_t cargo;
  char *args [3];
  longlong a;
  cargo_t local_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  undefined8 local_18;
  
  iVar2 = cargo_init(&local_40,0,"program");
  if (iVar2 == 0) {
    local_18 = 0;
    iVar2 = cargo_add_option(local_40,0,"--alpha -a",(char *)0x0,"L");
    ctx = local_40;
    if (iVar2 == 0) {
      vd = _cargo_create_range("long long int range",CARGO_LONGLONG);
      if (vd == (cargo_validation_t *)0x0) {
        vd = (cargo_validation_t *)0x0;
      }
      else {
        puVar1 = (undefined8 *)vd->user;
        *puVar1 = 10;
        puVar1[1] = 0x14;
        puVar1[2] = 0;
      }
      iVar2 = cargo_add_validation(ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (iVar2 == 0) {
        local_28 = "-2";
        local_38 = "program";
        pcStack_30 = "--alpha";
        pcVar3 = (char *)0x0;
        iVar2 = cargo_parse(local_40,0,1,3,&local_38);
        if (iVar2 < 0) {
          local_28 = "10";
          local_38 = "program";
          pcStack_30 = "--alpha";
          iVar2 = cargo_parse(local_40,0,1,3,&local_38);
          if (iVar2 == 0) {
            local_28 = "15";
            local_38 = "program";
            pcStack_30 = "--alpha";
            iVar2 = cargo_parse(local_40,0,1,3,&local_38);
            if (iVar2 == 0) {
              local_28 = "20";
              local_38 = "program";
              pcStack_30 = "--alpha";
              iVar2 = cargo_parse(local_40,0,1,3,&local_38);
              if (iVar2 == 0) {
                local_28 = "123";
                local_38 = "program";
                pcStack_30 = "--alpha";
                iVar2 = cargo_parse(local_40,0,1,3,&local_38);
                if (-1 < iVar2) {
                  pcVar3 = "Expected parse failure for 123";
                }
              }
              else {
                pcVar3 = "Failed to parse";
              }
            }
            else {
              pcVar3 = "Failed to parse";
            }
          }
          else {
            pcVar3 = "Failed to parse";
          }
        }
        else {
          pcVar3 = "Expected parse failure for -2";
        }
      }
      else {
        pcVar3 = "Failed to add validation";
      }
    }
    else {
      pcVar3 = "Failed to add option";
    }
    cargo_destroy(&local_40);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_longlong_range_validation)
{
    long long int a = 0;
    _CARGO_ADD_TEST_VALIDATE("L", &a, cargo_validate_longlong_range, 10, 20);
    _CARGO_TEST_VALIDATE_VALUE(-2, 1);
    _CARGO_TEST_VALIDATE_VALUE(10, 0);
    _CARGO_TEST_VALIDATE_VALUE(15, 0);
    _CARGO_TEST_VALIDATE_VALUE(20, 0);
    _CARGO_TEST_VALIDATE_VALUE(123, 1);
    _TEST_CLEANUP();
}